

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall sf::RenderTarget::popGLStates(RenderTarget *this)

{
  bool bVar1;
  ulong uVar2;
  long *in_RDI;
  Uint64 in_stack_00000008;
  
  bVar1 = anon_unknown.dwarf_1aa64e::RenderTargetImpl::isActive(in_stack_00000008);
  if ((bVar1) || (uVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), (uVar2 & 1) != 0)) {
    (*sf_glad_glMatrixMode)(0x1701);
    (*sf_glad_glPopMatrix)();
    (*sf_glad_glMatrixMode)(0x1700);
    (*sf_glad_glPopMatrix)();
    (*sf_glad_glMatrixMode)(0x1702);
    (*sf_glad_glPopMatrix)();
    (*sf_glad_glPopClientAttrib)();
    (*sf_glad_glPopAttrib)();
  }
  return;
}

Assistant:

void RenderTarget::popGLStates()
{
    if (RenderTargetImpl::isActive(m_id) || setActive(true))
    {
        glCheck(glMatrixMode(GL_PROJECTION));
        glCheck(glPopMatrix());
        glCheck(glMatrixMode(GL_MODELVIEW));
        glCheck(glPopMatrix());
        glCheck(glMatrixMode(GL_TEXTURE));
        glCheck(glPopMatrix());
        #ifndef SFML_OPENGL_ES
            glCheck(glPopClientAttrib());
            glCheck(glPopAttrib());
        #endif
    }
}